

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  ushort *puVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  BYTE *pBVar10;
  ushort *puVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  ushort *puVar15;
  ushort *puVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  uint uVar19;
  BYTE *pBVar20;
  BYTE *dstEnd;
  BYTE *pBVar21;
  BYTE *e;
  int iVar22;
  BYTE *d;
  ulong uVar23;
  ulong uVar24;
  BYTE *s;
  ushort *puVar25;
  ushort *puVar26;
  
  iVar22 = -1;
  if (source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        iVar22 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxDecompressedSize);
      puVar3 = (ushort *)(source + (long)compressedSize + -0x10);
      iVar22 = (int)source;
      dstEnd = (BYTE *)dest;
      if (maxDecompressedSize < 0x40) goto LAB_001097ff;
LAB_001093ff:
      puVar26 = (ushort *)((long)source + 1);
      bVar4 = (byte)*(ushort *)source;
      uVar9 = (uint)bVar4;
      uVar24 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= puVar26) goto LAB_00109833;
        puVar16 = (ushort *)((long)source + 2);
        uVar19 = 0;
        puVar15 = (ushort *)((long)source + 0x10);
        do {
          puVar25 = puVar26;
          puVar11 = puVar15;
          puVar26 = (ushort *)((long)puVar25 + 1);
          uVar19 = uVar19 + *(byte *)((long)puVar11 + -0xf);
          puVar16 = (ushort *)((long)puVar16 + 1);
          puVar15 = (ushort *)((long)puVar11 + 1);
        } while (puVar11 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar11 + -0xf) == 0xff);
        uVar24 = (ulong)uVar19 + 0xf;
        pBVar20 = dstEnd + uVar24;
        if ((CARRY8((ulong)dstEnd,uVar24)) || ((ulong)-(long)puVar16 < uVar24)) {
          puVar26 = puVar11 + -7;
          goto LAB_00109833;
        }
        if (dest + (long)maxDecompressedSize + -0x20 < pBVar20) goto LAB_00109715;
        puVar15 = (ushort *)((ulong)uVar19 + (long)puVar11 + 1);
        if (puVar1 + -0x10 < puVar15) {
          puVar26 = puVar11 + -7;
          goto LAB_00109715;
        }
        lVar12 = 0;
        do {
          uVar7 = *(undefined8 *)((byte *)((long)puVar26 + lVar12) + 8);
          pBVar17 = dstEnd + lVar12;
          *(undefined8 *)pBVar17 = *(undefined8 *)((long)puVar26 + lVar12);
          *(undefined8 *)(pBVar17 + 8) = uVar7;
          pbVar14 = (byte *)((long)puVar25 + lVar12 + 0x11);
          uVar7 = *(undefined8 *)(pbVar14 + 8);
          *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)pbVar14;
          *(undefined8 *)(pBVar17 + 0x18) = uVar7;
          lVar12 = lVar12 + 0x20;
        } while (pBVar17 + 0x20 < pBVar20);
      }
      else {
        pBVar20 = dstEnd + uVar24;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar26) goto LAB_00109715;
        uVar7 = *(undefined8 *)((long)source + 9);
        *(undefined8 *)dstEnd = *(undefined8 *)puVar26;
        *(undefined8 *)(dstEnd + 8) = uVar7;
        puVar15 = (ushort *)(uVar24 + (long)puVar26);
      }
      uVar6 = *puVar15;
      uVar13 = (ulong)uVar6;
      source = (char *)(puVar15 + 1);
      pBVar17 = pBVar20 + -uVar13;
      uVar23 = (ulong)(bVar4 & 0xf);
      if (uVar23 == 0xf) {
        puVar26 = (ushort *)source;
        if (pBVar17 < dest) goto LAB_00109833;
        uVar9 = 0;
        puVar15 = (ushort *)source;
        do {
          source = (char *)((long)puVar15 + 1);
          puVar26 = (ushort *)source;
          if (puVar1 + -2 <= source) goto LAB_00109833;
          uVar8 = *puVar15;
          uVar9 = uVar9 + (byte)uVar8;
          puVar15 = (ushort *)source;
        } while ((byte)uVar8 == 0xff);
        uVar24 = (ulong)uVar9;
        if ((BYTE *)(-uVar24 - 0x10) < pBVar20) goto LAB_00109833;
        uVar23 = uVar24 + 0x13;
        if (pBVar2 + -0x40 <= pBVar20 + uVar24 + 0x13) goto LAB_0010979c;
LAB_00109580:
        puVar26 = (ushort *)source;
        if (pBVar17 < dest) goto LAB_00109833;
        dstEnd = pBVar20 + uVar23;
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset(pBVar20,pBVar17,dstEnd,uVar13);
        }
        else {
          do {
            uVar7 = *(undefined8 *)(pBVar20 + -uVar13 + 8);
            *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar20 + -uVar13);
            *(undefined8 *)(pBVar20 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar20 + -uVar13 + 0x10 + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar20 + -uVar13 + 0x10);
            *(undefined8 *)(pBVar20 + 0x18) = uVar7;
            pBVar20 = pBVar20 + 0x20;
          } while (pBVar20 < dstEnd);
        }
      }
      else {
        dstEnd = pBVar20 + uVar23 + 4;
        uVar23 = uVar23 + 4;
        if (pBVar2 + -0x40 <= dstEnd) goto LAB_0010979c;
        if ((pBVar17 < dest) || (uVar6 < 8)) goto LAB_00109580;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
        *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar17 + 8);
        *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
      }
      goto LAB_001093ff;
    }
  }
  return iVar22;
LAB_0010979c:
  puVar26 = (ushort *)source;
  if (pBVar17 < dest) {
LAB_00109833:
    return ~(uint)puVar26 + iVar22;
  }
  dstEnd = pBVar20 + uVar23;
  if ((uint)uVar13 < 8) {
    pBVar20[0] = '\0';
    pBVar20[1] = '\0';
    pBVar20[2] = '\0';
    pBVar20[3] = '\0';
    *pBVar20 = *pBVar17;
    pBVar20[1] = pBVar17[1];
    pBVar20[2] = pBVar17[2];
    pBVar20[3] = pBVar17[3];
    uVar24 = (ulong)((uint)uVar13 << 2);
    uVar13 = (ulong)*(uint *)((long)inc32table + uVar24);
    *(undefined4 *)(pBVar20 + 4) = *(undefined4 *)(pBVar17 + uVar13);
    pBVar17 = pBVar17 + (uVar13 - (long)*(int *)((long)dec64table + uVar24));
  }
  else {
    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
    pBVar17 = pBVar17 + 8;
  }
  pBVar10 = pBVar20 + 8;
  if (pBVar2 + -0xc < dstEnd) {
    if (pBVar2 + -5 < dstEnd) goto LAB_00109833;
    pBVar20 = pBVar2 + -7;
    pBVar18 = pBVar17;
    pBVar21 = pBVar10;
    if (pBVar10 < pBVar20) {
      do {
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar18;
        pBVar21 = pBVar21 + 8;
        pBVar18 = pBVar18 + 8;
      } while (pBVar21 < pBVar20);
      pBVar17 = pBVar17 + ((long)pBVar20 - (long)pBVar10);
      pBVar10 = pBVar20;
    }
    for (; pBVar10 < dstEnd; pBVar10 = pBVar10 + 1) {
      BVar5 = *pBVar17;
      pBVar17 = pBVar17 + 1;
      *pBVar10 = BVar5;
    }
  }
  else {
    *(undefined8 *)pBVar10 = *(undefined8 *)pBVar17;
    if (0x10 < uVar23) {
      pBVar20 = pBVar20 + 0x10;
      do {
        pBVar17 = pBVar17 + 8;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
        pBVar20 = pBVar20 + 8;
      } while (pBVar20 < dstEnd);
    }
  }
LAB_001097ff:
  bVar4 = (byte)*(ushort *)source;
  puVar26 = (ushort *)((long)source + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar24 = (ulong)(uint)(bVar4 >> 4);
    if ((puVar3 <= puVar26) || (dest + (long)maxDecompressedSize + -0x20 < dstEnd))
    goto LAB_0010970f;
    uVar7 = *(undefined8 *)(puVar26 + 4);
    *(undefined8 *)dstEnd = *(undefined8 *)puVar26;
    *(undefined8 *)(dstEnd + 8) = uVar7;
    pBVar20 = dstEnd + uVar24;
    uVar23 = (ulong)(uVar9 & 0xf);
    source = (char *)((ushort *)((long)puVar26 + uVar24) + 1);
    uVar6 = *(ushort *)((long)puVar26 + uVar24);
    uVar13 = (ulong)uVar6;
    pBVar17 = pBVar20 + -uVar13;
    if ((((uVar9 & 0xf) == 0xf) || (uVar6 < 8)) || (pBVar17 < dest)) goto LAB_0010975c;
    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
    *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar17 + 8);
    *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
    dstEnd = pBVar20 + uVar23 + 4;
    bVar4 = *(byte *)((long)puVar26 + uVar24 + 2);
    puVar26 = (ushort *)((long)puVar26 + uVar24 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= puVar26) goto LAB_00109833;
  pbVar14 = (byte *)((long)puVar26 + 1);
  uVar19 = 0;
  do {
    uVar6 = *puVar26;
    puVar26 = (ushort *)((long)puVar26 + 1);
    uVar19 = uVar19 + (byte)uVar6;
    pbVar14 = pbVar14 + 1;
  } while (puVar26 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar24 = (ulong)uVar19 + 0xf;
  if ((CARRY8((ulong)dstEnd,uVar24)) || ((ulong)-(long)pbVar14 < uVar24)) goto LAB_00109833;
LAB_0010970f:
  pBVar20 = dstEnd + uVar24;
LAB_00109715:
  puVar15 = (ushort *)((long)puVar26 + uVar24);
  if ((pBVar2 + -0xc < pBVar20) || (puVar1 + -4 < puVar15)) {
    if ((puVar15 == puVar1) && (pBVar20 <= pBVar2)) {
      memmove(dstEnd,puVar26,uVar24);
      return ((int)dstEnd + (int)uVar24) - (int)dest;
    }
    goto LAB_00109833;
  }
  do {
    *(undefined8 *)dstEnd = *(undefined8 *)puVar26;
    dstEnd = dstEnd + 8;
    puVar26 = puVar26 + 4;
  } while (dstEnd < pBVar20);
  uVar13 = (ulong)*puVar15;
  source = (char *)(puVar15 + 1);
  pBVar17 = pBVar20 + -uVar13;
  uVar23 = (ulong)(uVar9 & 0xf);
LAB_0010975c:
  if ((int)uVar23 == 0xf) {
    uVar9 = 0;
    do {
      puVar26 = (ushort *)source;
      source = (char *)((long)puVar26 + 1);
      if (puVar1 + -2 <= source) goto LAB_00109830;
      uVar9 = uVar9 + (byte)*puVar26;
    } while ((byte)*puVar26 == 0xff);
    uVar23 = (ulong)uVar9 + 0xf;
    if (CARRY8((ulong)pBVar20,uVar23)) {
LAB_00109830:
      puVar26 = (ushort *)((long)puVar26 + 1);
      goto LAB_00109833;
    }
  }
  uVar23 = uVar23 + 4;
  goto LAB_0010979c;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}